

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

void param(item *x)

{
  char *msg;
  
  if (currentSymbol == 0x12d) {
    getSymbol();
    if (currentSymbol == 0x1f7) {
      loadStringLiteralToHeap(x);
      getSymbol();
    }
    else {
      simpleExpression(x);
    }
    if (currentSymbol == 0x12e) {
      getSymbol();
      return;
    }
    msg = "missing right paranetheses";
  }
  else {
    msg = "missing (";
  }
  mark(msg);
  exit(-1);
}

Assistant:

procedure
void param(struct item *x) {
	if (currentSymbol == SYMBOL_LPARAN) {
		getSymbol();
	} else {
		mark("missing (");
		exit(-1);
	}
	if (currentSymbol == SYMBOL_STRINGLITERAL) {
		loadStringLiteralToHeap(x);
		getSymbol();
	} else {
		simpleExpression(x);
	}
	if (currentSymbol == SYMBOL_RPARAN) {
		getSymbol();
	} else {
		mark("missing right paranetheses");
		exit(-1);
	}
}